

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_48(QPDF *pdf,char *arg2)

{
  char cVar1;
  int iVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  char *pcVar6;
  char *pcVar7;
  long *plVar8;
  undefined1 in_R8B;
  long lVar9;
  pointer pbVar10;
  QPDFObjectHandle QVar11;
  QPDFObjectHandle QVar12;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle QVar14;
  QPDFObjectHandle QVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  QPDFObjectHandle QVar16;
  QPDFObjectHandle QVar17;
  QPDFObjectHandle QVar18;
  QPDFObjectHandle QVar19;
  QPDFObjectHandle QVar20;
  QPDFObjectHandle QVar21;
  QPDFObjectHandle QVar22;
  QPDFObjectHandle QVar23;
  QPDFObjectHandle QVar24;
  QPDFObjectHandle QVar25;
  QPDFObjectHandle QVar26;
  iterator __begin1_1;
  QPDFNameTreeObjectHelper bad5;
  iterator last;
  QPDFNameTreeObjectHelper bad2;
  iterator iter2;
  QPDFNameTreeObjectHelper bad1;
  iterator iter1;
  QPDFNameTreeObjectHelper bad3;
  QPDFObjectHandle oh;
  QPDFObjectHandle qtest;
  QPDFNameTreeObjectHelper bad6;
  QPDFNameTreeObjectHelper bad4;
  QPDFNameTreeObjectHelper new1;
  QPDFNameTreeObjectHelper ntoh;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empties;
  QPDFNameTreeObjectHelper new2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ntoh_map;
  undefined1 local_578 [32];
  long *local_558 [2];
  long local_548;
  element_type *local_540;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  iterator local_530;
  undefined1 local_4e8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d8;
  long *local_4a0 [2];
  long local_490 [5];
  iterator local_468;
  long *local_420;
  long local_418;
  long local_410 [5];
  iterator local_3e8;
  long *local_3a0 [2];
  long local_390 [5];
  undefined8 local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_360;
  long *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_350;
  long local_348 [2];
  undefined8 local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  undefined8 local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_320;
  long *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_310;
  long local_308 [5];
  pointer local_2e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d0;
  string local_2c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  string local_2b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b0;
  string local_2a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  string local_298 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_290;
  string local_288 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  string local_278 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  string local_268 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_260;
  string local_258 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  string local_248 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  string local_238 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  long *local_228 [2];
  long local_218 [5];
  QPDF local_1f0 [56];
  QPDFNameTreeObjectHelper local_1b8 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  string local_168 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_160;
  string local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  string local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  string local_138 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  QPDF local_128 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_f0;
  iterator local_c0;
  iterator local_78;
  
  QPDF::getTrailer();
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"/QTest","");
  QPDFObjectHandle::getKey((string *)&local_328);
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_3e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_3e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  local_338 = local_328;
  local_330 = local_320;
  if (local_320 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_320->_M_use_count = local_320->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_320->_M_use_count = local_320->_M_use_count + 1;
    }
  }
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_338;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(local_1b8,QVar11,(QPDF *)0x1,(bool)in_R8B);
  if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
  }
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while (cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_4e8,&local_3e8),
        cVar1 == '\0') {
    puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_468._vptr_iterator,
                        (long)local_468.impl.
                              super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_468._vptr_iterator !=
        &local_468.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_468._vptr_iterator,
                      (ulong)((long)&(local_468.impl.
                                      super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_4e8);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_3e8);
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_4e8);
  QPDFNameTreeObjectHelper::getAsMap_abi_cxx11_();
  for (p_Var5 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_f0._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," -> ",4);
    QPDFObjectHandle::getStringValue_abi_cxx11_();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)local_4e8._0_8_,local_4e8._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
      operator_delete((void *)local_4e8._0_8_,
                      (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
    }
  }
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"11 elephant","");
  cVar1 = QPDFNameTreeObjectHelper::hasName((string *)local_1b8);
  if (cVar1 == '\0') {
    __assert_fail("ntoh.hasName(\"11 elephant\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x727,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,anon_var_dwarf_19773,anon_var_dwarf_19773 + 10);
  cVar1 = QPDFNameTreeObjectHelper::hasName((string *)local_1b8);
  if (cVar1 == '\0') {
    __assert_fail("ntoh.hasName(\"07 sev\\xe2\\x80\\xa2n\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x728,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"potato","");
  cVar1 = QPDFNameTreeObjectHelper::hasName((string *)local_1b8);
  if (cVar1 != '\0') {
    __assert_fail("!ntoh.hasName(\"potato\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x729,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_368 = 0;
  p_Stack_360 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"potato","");
  cVar1 = QPDFNameTreeObjectHelper::findObject((string *)local_1b8,(QPDFObjectHandle *)local_4e8);
  if (cVar1 != '\0') {
    __assert_fail("!ntoh.findObject(\"potato\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72b,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_4e8._0_8_ = &local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,anon_var_dwarf_19773,anon_var_dwarf_19773 + 10);
  cVar1 = QPDFNameTreeObjectHelper::findObject((string *)local_1b8,(QPDFObjectHandle *)local_4e8);
  if (cVar1 == '\0') {
    __assert_fail("ntoh.findObject(\"07 sev\\xe2\\x80\\xa2n\", oh)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72c,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare(local_4e8);
  if (iVar2 != 0) {
    __assert_fail("\"seven!\" == oh.getStringValue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72d,"void test_48(QPDF &, const char *)");
  }
  if ((element_type *)local_4e8._0_8_ != (element_type *)&local_4d8) {
    operator_delete((void *)local_4e8._0_8_,
                    (ulong)((long)&(local_4d8._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::last();
  pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar2 = std::__cxx11::string::compare(pcVar6);
  if (iVar2 != 0) {
    __assert_fail("last->first == \"29 twenty-nine\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x72f,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  iVar2 = std::__cxx11::string::compare((char *)&local_3e8);
  if (iVar2 != 0) {
    __assert_fail("last->second.getUTF8Value() == \"twenty-nine!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x730,"void test_48(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_3e8._vptr_iterator !=
      &local_3e8.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_3e8._vptr_iterator,
                    (ulong)((long)&(local_3e8.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::newEmpty(local_1f0,SUB81(pdf,0));
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x734,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
  QPDFNameTreeObjectHelper::iterator::operator++(&local_3e8);
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x736,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
  QPDFNameTreeObjectHelper::iterator::operator--(&local_3e8);
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x738,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
  local_468._vptr_iterator =
       (_func_int **)
       &local_468.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"1","");
  local_578._0_8_ = local_578 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"1","");
  QPDFObjectHandle::newString(local_238);
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_468;
  QVar12.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f0;
  QPDFNameTreeObjectHelper::insert((string *)&local_78,QVar12);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_78);
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
    operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_468._vptr_iterator !=
      &local_468.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_468._vptr_iterator,
                    (ulong)((long)&(local_468.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::iterator::operator++(&local_3e8);
  pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar2 = std::__cxx11::string::compare(pcVar6);
  if (iVar2 != 0) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73b,"void test_48(QPDF &, const char *)");
  }
  pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
  QPDFNameTreeObjectHelper::iterator::operator--(&local_3e8);
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
  if (cVar1 == '\0') {
    __assert_fail("iter1 == new1.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x73e,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
  QPDFNameTreeObjectHelper::iterator::operator--(&local_3e8);
  pcVar7 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar2 = std::__cxx11::string::compare(pcVar7);
  if (iVar2 != 0) {
    __assert_fail("iter1->first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x740,"void test_48(QPDF &, const char *)");
  }
  iVar2 = std::__cxx11::string::compare(pcVar6);
  if (iVar2 != 0) {
    __assert_fail("iter1_val.first == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x741,"void test_48(QPDF &, const char *)");
  }
  local_468._vptr_iterator =
       (_func_int **)
       &local_468.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"2","");
  local_578._0_8_ = local_578 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"2","");
  QPDFObjectHandle::newString(local_248);
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_468;
  QVar13.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f0;
  QPDFNameTreeObjectHelper::insert((string *)&local_c0,QVar13);
  QPDFNameTreeObjectHelper::iterator::~iterator(&local_c0);
  if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
  }
  if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
    operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_468._vptr_iterator !=
      &local_468.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete(local_468._vptr_iterator,
                    (ulong)((long)&(local_468.impl.
                                    super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFNameTreeObjectHelper::iterator::operator++(&local_3e8);
  pcVar7 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
  iVar2 = std::__cxx11::string::compare(pcVar7);
  if (iVar2 != 0) {
    __assert_fail("iter1->first == \"2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x744,"void test_48(QPDF &, const char *)");
  }
  iVar2 = std::__cxx11::string::compare(pcVar6);
  if (iVar2 != 0) {
    __assert_fail("iter1_val.first == \"2\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x745,"void test_48(QPDF &, const char *)");
  }
  QPDFNameTreeObjectHelper::iterator::operator++(&local_3e8);
  QPDFNameTreeObjectHelper::end();
  cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
  if (cVar1 != '\0') {
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
    if (*(long *)(pcVar6 + 0x20) != 0) {
      __assert_fail("!iter1_val.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x748,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator++(&local_3e8);
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("iter1->first == \"1\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74a,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::operator--(&local_3e8);
    QPDFNameTreeObjectHelper::end();
    cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_3e8,&local_468);
    if (cVar1 == '\0') {
      __assert_fail("iter1 == new1.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74c,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
    QPDFNameTreeObjectHelper::iterator::operator--(&local_3e8);
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("iter1->first == \"2\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x74e,"void test_48(QPDF &, const char *)");
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"insertAfter",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFNameTreeObjectHelper::newEmpty(local_128,SUB81(pdf,0));
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    cVar1 = QPDFNameTreeObjectHelper::iterator::operator==(&local_468,(iterator *)local_578);
    if (cVar1 == '\0') {
      __assert_fail("iter2 == new2.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x753,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"3","");
    local_530._vptr_iterator =
         (_func_int **)
         &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"3!","");
    QPDFObjectHandle::newString(local_258);
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258;
    QVar14.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_578;
    QPDFNameTreeObjectHelper::iterator::insertAfter((string *)&local_468,QVar14);
    if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
        &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_530._vptr_iterator,
                      (ulong)((long)&(local_530.impl.
                                      super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("iter2->first == \"3\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x755,"void test_48(QPDF &, const char *)");
    }
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"4","");
    local_530._vptr_iterator =
         (_func_int **)
         &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"4!","");
    QPDFObjectHandle::newString(local_268);
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268;
    QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_578;
    QPDFNameTreeObjectHelper::iterator::insertAfter((string *)&local_468,QVar15);
    if (local_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
        &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_530._vptr_iterator,
                      (ulong)((long)&(local_530.impl.
                                      super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("iter2->first == \"4\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x757,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while (cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530),
          cVar1 == '\0') {
      puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_420,local_418);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_420 != local_410) {
        operator_delete(local_420,local_410[0] + 1);
      }
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_578);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Empty1","");
    plVar8 = &local_548;
    local_558[0] = plVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_558,"/Empty2","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_578;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_180,__l,(allocator_type *)&local_530);
    lVar9 = -0x40;
    do {
      if (plVar8 != (long *)plVar8[-2]) {
        operator_delete((long *)plVar8[-2],*plVar8 + 1);
      }
      plVar8 = plVar8 + -4;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0);
    local_2e0 = local_180.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_180.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_180.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar10 = local_180.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar10->_M_dataplus)._M_p,
                            pbVar10->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        QPDF::getTrailer();
        QPDFObjectHandle::getKey(local_138);
        QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
        QVar16.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_138;
        QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                  ((QPDFNameTreeObjectHelper *)&local_420,QVar16,(QPDF *)0x1,(bool)in_R8B);
        if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
        }
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::end();
        cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530);
        if (cVar1 == '\0') {
          __assert_fail("empty.begin() == empty.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x760,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
        QPDFNameTreeObjectHelper::last();
        QPDFNameTreeObjectHelper::end();
        cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530);
        if (cVar1 == '\0') {
          __assert_fail("empty.last() == empty.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x761,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
        local_530._vptr_iterator =
             (_func_int **)
             &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"five","");
        local_4a0[0] = local_490;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"5","");
        QPDFObjectHandle::newString(local_148);
        QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_530;
        QVar17.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_420;
        QPDFNameTreeObjectHelper::insert((string *)local_578,QVar17);
        if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
            &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_530._vptr_iterator,
                          (ulong)((long)&(local_530.impl.
                                          super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("i->first == \"five\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x763,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)&local_530);
        if (iVar2 != 0) {
          __assert_fail("i->second.getStringValue() == \"5\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x764,"void test_48(QPDF &, const char *)");
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
            &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_530._vptr_iterator,
                          (ulong)((long)&(local_530.impl.
                                          super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        QPDFNameTreeObjectHelper::begin();
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("empty.begin()->first == \"five\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x765,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::last();
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("empty.last()->first == \"five\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x766,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_4a0);
        if (iVar2 != 0) {
          __assert_fail("empty.begin()->second.getStringValue() == \"5\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x767,"void test_48(QPDF &, const char *)");
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        local_4a0[0] = local_490;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"five","");
        local_3a0[0] = local_390;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"5+","");
        QPDFObjectHandle::newString(local_158);
        QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0;
        QVar18.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_420;
        QPDFNameTreeObjectHelper::insert((string *)&local_530,QVar18);
        local_578._8_8_ =
             local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 0x10),
                   &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::_M_assign((string *)(local_578 + 0x18));
        local_540 = local_530.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_538,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_530.ivalue.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
        }
        if (local_3a0[0] != local_390) {
          operator_delete(local_3a0[0],local_390[0] + 1);
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("i->first == \"five\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x769,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)&local_530);
        if (iVar2 != 0) {
          __assert_fail("i->second.getStringValue() == \"5+\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x76a,"void test_48(QPDF &, const char *)");
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
            &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_530._vptr_iterator,
                          (ulong)((long)&(local_530.impl.
                                          super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_4a0);
        if (iVar2 != 0) {
          __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x76b,"void test_48(QPDF &, const char *)");
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        local_4a0[0] = local_490;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"six","");
        local_3a0[0] = local_390;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"6","");
        QPDFObjectHandle::newString(local_168);
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0;
        QVar19.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_420;
        QPDFNameTreeObjectHelper::insert((string *)&local_530,QVar19);
        local_578._8_8_ =
             local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 0x10),
                   &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::_M_assign((string *)(local_578 + 0x18));
        local_540 = local_530.ivalue.second.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_538,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_530.ivalue.second.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> + 8));
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        if (local_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160);
        }
        if (local_3a0[0] != local_390) {
          operator_delete(local_3a0[0],local_390[0] + 1);
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("i->first == \"six\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x76d,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)&local_530);
        if (iVar2 != 0) {
          __assert_fail("i->second.getStringValue() == \"6\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x76e,"void test_48(QPDF &, const char *)");
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
            &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount) {
          operator_delete(local_530._vptr_iterator,
                          (ulong)((long)&(local_530.impl.
                                          super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        QPDFNameTreeObjectHelper::begin();
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_4a0);
        if (iVar2 != 0) {
          __assert_fail("empty.begin()->second.getStringValue() == \"5+\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x76f,"void test_48(QPDF &, const char *)");
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::last();
        pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        iVar2 = std::__cxx11::string::compare(pcVar6);
        if (iVar2 != 0) {
          __assert_fail("empty.last()->first == \"six\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x770,"void test_48(QPDF &, const char *)");
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::last();
        QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        iVar2 = std::__cxx11::string::compare((char *)local_4a0);
        if (iVar2 != 0) {
          __assert_fail("empty.last()->second.getStringValue() == \"6\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                        ,0x771,"void test_48(QPDF &, const char *)");
        }
        if (local_4a0[0] != local_490) {
          operator_delete(local_4a0[0],local_490[0] + 1);
        }
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)&local_420);
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_2e0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/Bad1 -- wrong key type",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDF::getTrailer();
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad1","");
    QPDFObjectHandle::getKey(local_278);
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar20.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_278;
    QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
              ((QPDFNameTreeObjectHelper *)&local_420,QVar20,(QPDF *)0x1,(bool)in_R8B);
    if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    local_530._vptr_iterator =
         (_func_int **)
         &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"G","");
    QPDFNameTreeObjectHelper::find((string *)local_578,SUB81(&local_420,0));
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("bad1.find(\"G\", true)->first == \"A\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x776,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
        &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_530._vptr_iterator,
                      (ulong)((long)&(local_530.impl.
                                      super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while (cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530),
          cVar1 == '\0') {
      puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_578);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/Bad2 -- invalid kid",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDF::getTrailer();
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad2","");
    QPDFObjectHandle::getKey(local_288);
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar21.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_288;
    QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
              ((QPDFNameTreeObjectHelper *)local_4a0,QVar21,(QPDF *)0x1,(bool)in_R8B);
    if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    local_530._vptr_iterator =
         (_func_int **)
         &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"G","");
    QPDFNameTreeObjectHelper::find((string *)local_578,SUB81(local_4a0,0));
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 != 0) {
      __assert_fail("bad2.find(\"G\", true)->first == \"B\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x77d,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
        &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    {
      operator_delete(local_530._vptr_iterator,
                      (ulong)((long)&(local_530.impl.
                                      super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
    }
    QPDFNameTreeObjectHelper::begin();
    QPDFNameTreeObjectHelper::end();
    while (cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530),
          cVar1 == '\0') {
      puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_578);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/Bad3 -- invalid kid",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDF::getTrailer();
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad3","");
    QPDFObjectHandle::getKey(local_298);
    QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar22.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_298;
    QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
              ((QPDFNameTreeObjectHelper *)local_3a0,QVar22,(QPDF *)0x1,(bool)in_R8B);
    if (local_290 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_290);
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"G","");
    QPDFNameTreeObjectHelper::find((string *)local_578,SUB81(local_3a0,0));
    QPDFNameTreeObjectHelper::end();
    cVar1 = QPDFNameTreeObjectHelper::iterator::operator==((iterator *)local_578,&local_530);
    if (cVar1 == '\0') {
      __assert_fail("bad3.find(\"G\", true) == bad3.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x784,"void test_48(QPDF &, const char *)");
    }
    QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"/Bad4 -- invalid kid",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDF::getTrailer();
    local_578._0_8_ = local_578 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad4","");
    QPDFObjectHandle::getKey(local_2a8);
    QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
    QVar23.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2a8;
    QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
              ((QPDFNameTreeObjectHelper *)local_228,QVar23,(QPDF *)0x1,(bool)in_R8B);
    if (local_2a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0);
    }
    if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
      operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    local_530._vptr_iterator =
         (_func_int **)
         &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"F","");
    QPDFNameTreeObjectHelper::find((string *)local_578,SUB81(local_228,0));
    pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
    iVar2 = std::__cxx11::string::compare(pcVar6);
    if (iVar2 == 0) {
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_530._vptr_iterator !=
          &local_530.impl.super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ) {
        operator_delete(local_530._vptr_iterator,
                        (ulong)((long)&(local_530.impl.
                                        super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      QPDFNameTreeObjectHelper::begin();
      QPDFNameTreeObjectHelper::end();
      while (cVar1 = QPDFNameTreeObjectHelper::iterator::operator==
                               ((iterator *)local_578,&local_530), cVar1 == '\0') {
        puVar3 = (undefined8 *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)*puVar3,puVar3[1]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_578);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator(&local_530);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"/Bad5 -- loop in find",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      QPDF::getTrailer();
      local_578._0_8_ = local_578 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad5","");
      QPDFObjectHandle::getKey(local_2b8);
      QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
      QVar24.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_2b8;
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                ((QPDFNameTreeObjectHelper *)&local_530,QVar24,(QPDF *)0x1,(bool)in_R8B);
      if (local_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0);
      }
      if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
        operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
      }
      if (local_310 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_310);
      }
      local_318 = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"F","");
      QPDFNameTreeObjectHelper::find((string *)local_578,SUB81(&local_530,0));
      pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      iVar2 = std::__cxx11::string::compare(pcVar6);
      if (iVar2 != 0) {
        __assert_fail("bad5.find(\"F\", true)->first == \"D\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                      ,0x78f,"void test_48(QPDF &, const char *)");
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
      if (local_318 != local_308) {
        operator_delete(local_318,local_308[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"/Bad6 -- bad limits",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      QPDF::getTrailer();
      local_578._0_8_ = local_578 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"/Bad6","");
      QPDFObjectHandle::getKey(local_2c8);
      QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
      QVar25.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_2c8;
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper
                ((QPDFNameTreeObjectHelper *)&local_318,QVar25,(QPDF *)0x1,(bool)in_R8B);
      if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c0);
      }
      if ((undefined1 *)local_578._0_8_ != local_578 + 0x10) {
        operator_delete((void *)local_578._0_8_,(ulong)(local_578._16_8_ + 1));
      }
      if (local_350 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_350);
      }
      local_358 = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"H","");
      QPDFObjectHandle::newNull();
      QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_358;
      QVar26.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)&local_318;
      QPDFNameTreeObjectHelper::insert((string *)local_578,QVar26);
      pcVar6 = (char *)QPDFNameTreeObjectHelper::iterator::operator->[abi_cxx11_();
      iVar2 = std::__cxx11::string::compare(pcVar6);
      if (iVar2 == 0) {
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_578);
        if (local_2d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d0);
        }
        if (local_358 != local_348) {
          operator_delete(local_358,local_348[0] + 1);
        }
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)&local_318);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)&local_530);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_228);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_3a0);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_4a0);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)&local_420);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_180);
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_468);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_128);
        QPDFNameTreeObjectHelper::iterator::~iterator(&local_3e8);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper((QPDFNameTreeObjectHelper *)local_1f0);
        QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_4e8);
        if (p_Stack_360 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_360);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
        ::~_Rb_tree(&local_f0);
        QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(local_1b8);
        if (local_320 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_320);
        }
        return;
      }
      __assert_fail("bad6.insert(\"H\", QPDFObjectHandle::newNull())->first == \"H\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                    ,0x793,"void test_48(QPDF &, const char *)");
    }
    __assert_fail("bad4.find(\"F\", true)->first == \"C\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x788,"void test_48(QPDF &, const char *)");
  }
  __assert_fail("iter1 == new1.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x747,"void test_48(QPDF &, const char *)");
}

Assistant:

static void
test_48(QPDF& pdf, char const* arg2)
{
    // Test name tree. This test is crafted to work with
    // name-tree.pdf
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFNameTreeObjectHelper ntoh(qtest, pdf);
    for (auto& iter: ntoh) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    std::map<std::string, QPDFObjectHandle> ntoh_map = ntoh.getAsMap();
    for (auto& iter: ntoh_map) {
        std::cout << iter.first << " -> " << iter.second.getStringValue() << std::endl;
    }
    assert(ntoh.hasName("11 elephant"));
    assert(ntoh.hasName("07 sev\xe2\x80\xa2n"));
    assert(!ntoh.hasName("potato"));
    QPDFObjectHandle oh;
    assert(!ntoh.findObject("potato", oh));
    assert(ntoh.findObject("07 sev\xe2\x80\xa2n", oh));
    assert("seven!" == oh.getStringValue());
    auto last = ntoh.last();
    assert(last->first == "29 twenty-nine");
    assert(last->second.getUTF8Value() == "twenty-nine!");

    auto new1 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter1 = new1.begin();
    assert(iter1 == new1.end());
    ++iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1 == new1.end());
    new1.insert("1", QPDFObjectHandle::newString("1"));
    ++iter1;
    assert(iter1->first == "1");
    auto& iter1_val = *iter1;
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "1");
    assert(iter1_val.first == "1");
    new1.insert("2", QPDFObjectHandle::newString("2"));
    ++iter1;
    assert(iter1->first == "2");
    assert(iter1_val.first == "2");
    ++iter1;
    assert(iter1 == new1.end());
    assert(!iter1_val.second);
    ++iter1;
    assert(iter1->first == "1");
    --iter1;
    assert(iter1 == new1.end());
    --iter1;
    assert(iter1->first == "2");

    std::cout << "insertAfter" << std::endl;
    auto new2 = QPDFNameTreeObjectHelper::newEmpty(pdf);
    auto iter2 = new2.begin();
    assert(iter2 == new2.end());
    iter2.insertAfter("3", QPDFObjectHandle::newString("3!"));
    assert(iter2->first == "3");
    iter2.insertAfter("4", QPDFObjectHandle::newString("4!"));
    assert(iter2->first == "4");
    for (auto& i: new2) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    std::vector<std::string> empties = {"/Empty1", "/Empty2"};
    for (auto const& k: empties) {
        std::cout << k << std::endl;
        auto empty = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey(k), pdf);
        assert(empty.begin() == empty.end());
        assert(empty.last() == empty.end());
        auto i = empty.insert("five", QPDFObjectHandle::newString("5"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5");
        assert(empty.begin()->first == "five");
        assert(empty.last()->first == "five");
        assert(empty.begin()->second.getStringValue() == "5");
        i = empty.insert("five", QPDFObjectHandle::newString("5+"));
        assert(i->first == "five");
        assert(i->second.getStringValue() == "5+");
        assert(empty.begin()->second.getStringValue() == "5+");
        i = empty.insert("six", QPDFObjectHandle::newString("6"));
        assert(i->first == "six");
        assert(i->second.getStringValue() == "6");
        assert(empty.begin()->second.getStringValue() == "5+");
        assert(empty.last()->first == "six");
        assert(empty.last()->second.getStringValue() == "6");
    }

    std::cout << "/Bad1 -- wrong key type" << std::endl;
    auto bad1 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad1"), pdf);
    assert(bad1.find("G", true)->first == "A");
    for (auto const& i: bad1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad2 -- invalid kid" << std::endl;
    auto bad2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad2"), pdf);
    assert(bad2.find("G", true)->first == "B");
    for (auto const& i: bad2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad3 -- invalid kid" << std::endl;
    auto bad3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad3"), pdf);
    assert(bad3.find("G", true) == bad3.end());

    std::cout << "/Bad4 -- invalid kid" << std::endl;
    auto bad4 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad4"), pdf);
    assert(bad4.find("F", true)->first == "C");
    for (auto const& i: bad4) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Bad5 -- loop in find" << std::endl;
    auto bad5 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad5"), pdf);
    assert(bad5.find("F", true)->first == "D");

    std::cout << "/Bad6 -- bad limits" << std::endl;
    auto bad6 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Bad6"), pdf);
    assert(bad6.insert("H", QPDFObjectHandle::newNull())->first == "H");
}